

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.c
# Opt level: O0

void PEM_dek_info(char *buf,char *type,int len,char *str)

{
  int iVar1;
  size_t sVar2;
  int n;
  int j;
  char *p;
  long i;
  int local_34;
  char *local_30;
  long local_28;
  
  sVar2 = strlen(buf);
  local_30 = buf + sVar2;
  local_34 = 0x400 - ((int)local_30 - (int)buf);
  iVar1 = BIO_snprintf(local_30,(long)local_34,"DEK-Info: %s,",type);
  if (0 < iVar1) {
    local_34 = local_34 - iVar1;
    local_30 = local_30 + iVar1;
    for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
      iVar1 = BIO_snprintf(local_30,(long)local_34,"%02X",(ulong)(byte)str[local_28]);
      if (iVar1 < 1) {
        return;
      }
      local_34 = local_34 - iVar1;
      local_30 = local_30 + iVar1;
    }
    if (1 < local_34) {
      strcpy(local_30,"\n");
    }
  }
  return;
}

Assistant:

void PEM_dek_info(char *buf, const char *type, int len, const char *str)
{
    long i;
    char *p = buf + strlen(buf);
    int j = PEM_BUFSIZE - (size_t)(p - buf), n;

    n = BIO_snprintf(p, j, "DEK-Info: %s,", type);
    if (n > 0) {
        j -= n;
        p += n;
        for (i = 0; i < len; i++) {
            n = BIO_snprintf(p, j, "%02X", 0xff & str[i]);
            if (n <= 0)
                return;
            j -= n;
            p += n;
        }
        if (j > 1)
            strcpy(p, "\n");
    }
}